

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O2

void __thiscall mjs::gc_heap::pointer_set::erase(pointer_set *this,gc_heap_ptr_untyped *p)

{
  gc_heap_ptr_untyped **ppgVar1;
  gc_heap_ptr_untyped *pgVar2;
  uint uVar3;
  ulong uVar4;
  gc_heap_ptr_untyped *__tmp;
  bool bVar5;
  
  uVar4 = (ulong)this->size_;
  ppgVar1 = this->set_;
  do {
    bVar5 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar5) {
      __assert_fail("!\"Pointer not found in set!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h"
                    ,0x10a,"void mjs::gc_heap::pointer_set::erase(const gc_heap_ptr_untyped &)");
    }
    pgVar2 = ppgVar1[uVar4];
  } while (pgVar2 != p);
  uVar3 = this->size_ - 1;
  this->size_ = uVar3;
  ppgVar1[uVar4] = ppgVar1[uVar3];
  ppgVar1[uVar3] = pgVar2;
  return;
}

Assistant:

void erase(const gc_heap_ptr_untyped& p) {
            // Search from the back since objects tend to be short lived
            for (uint32_t i = size_; i--;) {
                if (set_[i] == &p) {
                    std::swap(set_[i], set_[--size_]);
                    return;
                }
            }
            assert(!"Pointer not found in set!");
        }